

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

InterfaceHandle __thiscall
helics::CommonCore::registerTranslator
          (CommonCore *this,string_view translatorName,string_view endpointType,string_view units)

{
  GlobalFederateId global_federateId;
  BaseType BVar1;
  byte *__src;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  ActionMessage reg;
  ActionMessage local_e8;
  
  checkNewInterface(this,(LocalFederateId)0xfffffefd,translatorName,TRANSLATOR);
  global_federateId.gid = (this->translatorFedID)._M_i.gid;
  ppVar2 = createBasicHandle(this,global_federateId,(LocalFederateId)0x88ca6c00,TRANSLATOR,
                             translatorName,endpointType,units,0);
  BVar1 = *(BaseType *)((long)&(ppVar2->first)._M_dataplus._M_p + 4);
  ActionMessage::ActionMessage(&local_e8,cmd_reg_translator);
  __src = (byte *)(ppVar2->first).field_2._M_allocated_capacity;
  local_e8.payload.bufferSize = *(size_t *)((long)&(ppVar2->first).field_2 + 8);
  local_e8.source_id.gid = global_federateId.gid;
  local_e8.source_handle.hid = BVar1;
  if ((local_e8.payload.heap != __src) &&
     (SmallBuffer::reserve(&local_e8.payload,local_e8.payload.bufferSize),
     local_e8.payload.bufferSize != 0)) {
    memcpy(local_e8.payload.heap,__src,local_e8.payload.bufferSize);
  }
  if (endpointType._M_len != 0 || units._M_len != 0) {
    ActionMessage::setStringData(&local_e8,endpointType,units);
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&local_e8);
  ActionMessage::~ActionMessage(&local_e8);
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::registerTranslator(std::string_view translatorName,
                                               std::string_view endpointType,
                                               std::string_view units)
{
    // check to make sure the name isn't already used
    checkNewInterface(gLocalCoreId, translatorName, InterfaceType::TRANSLATOR);

    auto fid = translatorFedID.load();

    const auto& handle = createBasicHandle(
        fid, LocalFederateId(), InterfaceType::TRANSLATOR, translatorName, endpointType, units);
    auto hid = handle.getInterfaceHandle();

    ActionMessage reg(CMD_REG_TRANSLATOR);
    reg.source_id = fid;
    reg.source_handle = hid;
    reg.name(handle.key);
    if ((!endpointType.empty()) || (!units.empty())) {
        reg.setStringData(endpointType, units);
    }
    actionQueue.push(std::move(reg));
    return hid;
}